

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_conversion.cpp
# Opt level: O3

void duckdb::SetSelectionVector
               (SelectionVector *sel,data_ptr_t indices_p,LogicalType *logical_type,idx_t size,
               ValidityMask *mask,idx_t last_element_pos)

{
  LogicalTypeId LVar1;
  sel_t *psVar2;
  unsigned_long *puVar3;
  unsigned_long uVar4;
  NotImplementedException *this;
  ConversionException *pCVar5;
  idx_t iVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  uchar *indices;
  string local_90;
  string local_70;
  string local_50;
  
  SelectionVector::Initialize(sel,size);
  LVar1 = logical_type->id_;
  if (mask == (ValidityMask *)0x0) {
    switch(LVar1 - 0xb) {
    case 0:
      if (size != 0) {
        psVar2 = sel->sel_vector;
        iVar6 = 0;
        do {
          psVar2[iVar6] = (int)(char)indices_p[iVar6];
          iVar6 = iVar6 + 1;
        } while (size != iVar6);
      }
      break;
    case 1:
      if (size != 0) {
        psVar2 = sel->sel_vector;
        iVar6 = 0;
        do {
          psVar2[iVar6] = (int)*(short *)(indices_p + iVar6 * 2);
          iVar6 = iVar6 + 1;
        } while (size != iVar6);
      }
      break;
    case 2:
      if (size != 0) {
        psVar2 = sel->sel_vector;
        iVar6 = 0;
        do {
          psVar2[iVar6] = *(sel_t *)(indices_p + iVar6 * 4);
          iVar6 = iVar6 + 1;
        } while (size != iVar6);
      }
      break;
    case 3:
      if (last_element_pos >> 0x20 == 0) {
        if (size != 0) {
          psVar2 = sel->sel_vector;
          iVar6 = 0;
          do {
            psVar2[iVar6] = *(sel_t *)(indices_p + iVar6 * 8);
            iVar6 = iVar6 + 1;
          } while (size != iVar6);
        }
      }
      else if (size != 0) {
        iVar6 = 0;
        do {
          if (0xffffffff < *(long *)(indices_p + iVar6 * 8)) {
            pCVar5 = (ConversionException *)__cxa_allocate_exception(0x10);
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_90,"DuckDB only supports indices that fit on an uint32","");
            ConversionException::ConversionException(pCVar5,&local_90);
            __cxa_throw(pCVar5,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
          }
          uVar4 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                            (*(long *)(indices_p + iVar6 * 8));
          sel->sel_vector[iVar6] = (sel_t)uVar4;
          iVar6 = iVar6 + 1;
        } while (size != iVar6);
      }
      break;
    default:
      switch(LVar1) {
      case UTINYINT:
        if (size != 0) {
          psVar2 = sel->sel_vector;
          iVar6 = 0;
          do {
            psVar2[iVar6] = (uint)indices_p[iVar6];
            iVar6 = iVar6 + 1;
          } while (size != iVar6);
        }
        break;
      case USMALLINT:
        if (size != 0) {
          psVar2 = sel->sel_vector;
          iVar6 = 0;
          do {
            psVar2[iVar6] = (uint)*(ushort *)(indices_p + iVar6 * 2);
            iVar6 = iVar6 + 1;
          } while (size != iVar6);
        }
        break;
      case UINTEGER:
        if (size != 0) {
          psVar2 = sel->sel_vector;
          iVar6 = 0;
          do {
            psVar2[iVar6] = *(sel_t *)(indices_p + iVar6 * 4);
            iVar6 = iVar6 + 1;
          } while (size != iVar6);
        }
        break;
      case UBIGINT:
        psVar2 = sel->sel_vector;
        if (last_element_pos >> 0x20 == 0) {
          if (size != 0) {
            iVar6 = 0;
            do {
              psVar2[iVar6] = *(sel_t *)(indices_p + iVar6 * 8);
              iVar6 = iVar6 + 1;
            } while (size != iVar6);
          }
        }
        else if (size != 0) {
          iVar6 = 0;
          do {
            if (*(ulong *)(indices_p + iVar6 * 8) >> 0x20 != 0) {
              pCVar5 = (ConversionException *)__cxa_allocate_exception(0x10);
              local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_90,"DuckDB only supports indices that fit on an uint32",""
                        );
              ConversionException::ConversionException(pCVar5,&local_90);
              __cxa_throw(pCVar5,&ConversionException::typeinfo,::std::runtime_error::~runtime_error
                         );
            }
            psVar2[iVar6] = (sel_t)*(ulong *)(indices_p + iVar6 * 8);
            iVar6 = iVar6 + 1;
          } while (size != iVar6);
        }
        break;
      default:
        pCVar5 = (ConversionException *)__cxa_allocate_exception(0x10);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,"(Arrow) Unsupported type for selection vectors %s","");
        LogicalType::ToString_abi_cxx11_(&local_70,logical_type);
        ConversionException::ConversionException<std::__cxx11::string>
                  (pCVar5,&local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70);
        __cxa_throw(pCVar5,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
  }
  else {
    uVar8 = (uint)last_element_pos;
    switch(LVar1 - 0xb) {
    case 0:
      if (size != 0) {
        psVar2 = sel->sel_vector;
        puVar3 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        uVar7 = 0;
        do {
          if ((puVar3 == (unsigned_long *)0x0) ||
             (uVar9 = uVar8, (puVar3[uVar7 >> 6] >> (uVar7 & 0x3f) & 1) != 0)) {
            uVar9 = (uint)(char)indices_p[uVar7];
          }
          psVar2[uVar7] = uVar9;
          uVar7 = uVar7 + 1;
        } while (size != uVar7);
      }
      break;
    case 1:
      if (size != 0) {
        psVar2 = sel->sel_vector;
        puVar3 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        uVar7 = 0;
        do {
          if ((puVar3 == (unsigned_long *)0x0) ||
             (uVar9 = uVar8, (puVar3[uVar7 >> 6] >> (uVar7 & 0x3f) & 1) != 0)) {
            uVar9 = (uint)*(short *)(indices_p + uVar7 * 2);
          }
          psVar2[uVar7] = uVar9;
          uVar7 = uVar7 + 1;
        } while (size != uVar7);
      }
      break;
    case 2:
      if (size != 0) {
        psVar2 = sel->sel_vector;
        puVar3 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        uVar7 = 0;
        do {
          if ((puVar3 == (unsigned_long *)0x0) ||
             (uVar9 = uVar8, (puVar3[uVar7 >> 6] >> (uVar7 & 0x3f) & 1) != 0)) {
            uVar9 = *(uint *)(indices_p + uVar7 * 4);
          }
          psVar2[uVar7] = uVar9;
          uVar7 = uVar7 + 1;
        } while (size != uVar7);
      }
      break;
    case 3:
      if (last_element_pos >> 0x20 != 0) {
        pCVar5 = (ConversionException *)__cxa_allocate_exception(0x10);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,"DuckDB only supports indices that fit on an uint32","");
        ConversionException::ConversionException(pCVar5,&local_90);
        __cxa_throw(pCVar5,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (size != 0) {
        psVar2 = sel->sel_vector;
        puVar3 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        uVar7 = 0;
        do {
          if ((puVar3 == (unsigned_long *)0x0) ||
             (uVar9 = uVar8, (puVar3[uVar7 >> 6] >> (uVar7 & 0x3f) & 1) != 0)) {
            uVar9 = (uint)*(undefined8 *)(indices_p + uVar7 * 8);
          }
          psVar2[uVar7] = uVar9;
          uVar7 = uVar7 + 1;
        } while (size != uVar7);
      }
      break;
    default:
      switch(LVar1) {
      case UTINYINT:
        if (size != 0) {
          psVar2 = sel->sel_vector;
          puVar3 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          uVar7 = 0;
          do {
            if ((puVar3 == (unsigned_long *)0x0) ||
               (uVar9 = uVar8, (puVar3[uVar7 >> 6] >> (uVar7 & 0x3f) & 1) != 0)) {
              uVar9 = (uint)indices_p[uVar7];
            }
            psVar2[uVar7] = uVar9;
            uVar7 = uVar7 + 1;
          } while (size != uVar7);
        }
        break;
      case USMALLINT:
        if (size != 0) {
          psVar2 = sel->sel_vector;
          puVar3 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          uVar7 = 0;
          do {
            if ((puVar3 == (unsigned_long *)0x0) ||
               (uVar9 = uVar8, (puVar3[uVar7 >> 6] >> (uVar7 & 0x3f) & 1) != 0)) {
              uVar9 = (uint)*(ushort *)(indices_p + uVar7 * 2);
            }
            psVar2[uVar7] = uVar9;
            uVar7 = uVar7 + 1;
          } while (size != uVar7);
        }
        break;
      case UINTEGER:
        if (last_element_pos >> 0x20 != 0) {
          pCVar5 = (ConversionException *)__cxa_allocate_exception(0x10);
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_90,"DuckDB only supports indices that fit on an uint32","");
          ConversionException::ConversionException(pCVar5,&local_90);
          __cxa_throw(pCVar5,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
        }
        if (size != 0) {
          psVar2 = sel->sel_vector;
          puVar3 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          uVar7 = 0;
          do {
            if ((puVar3 == (unsigned_long *)0x0) ||
               (uVar9 = uVar8, (puVar3[uVar7 >> 6] >> (uVar7 & 0x3f) & 1) != 0)) {
              uVar9 = *(uint *)(indices_p + uVar7 * 4);
            }
            psVar2[uVar7] = uVar9;
            uVar7 = uVar7 + 1;
          } while (size != uVar7);
        }
        break;
      case UBIGINT:
        if (last_element_pos >> 0x20 != 0) {
          pCVar5 = (ConversionException *)__cxa_allocate_exception(0x10);
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_90,"DuckDB only supports indices that fit on an uint32","");
          ConversionException::ConversionException(pCVar5,&local_90);
          __cxa_throw(pCVar5,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
        }
        if (size != 0) {
          psVar2 = sel->sel_vector;
          puVar3 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          uVar7 = 0;
          do {
            if ((puVar3 == (unsigned_long *)0x0) ||
               (uVar9 = uVar8, (puVar3[uVar7 >> 6] >> (uVar7 & 0x3f) & 1) != 0)) {
              uVar9 = (uint)*(undefined8 *)(indices_p + uVar7 * 8);
            }
            psVar2[uVar7] = uVar9;
            uVar7 = uVar7 + 1;
          } while (size != uVar7);
        }
        break;
      default:
        this = (NotImplementedException *)__cxa_allocate_exception(0x10);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,"(Arrow) Unsupported type for selection vectors %s","");
        LogicalType::ToString_abi_cxx11_(&local_50,logical_type);
        NotImplementedException::NotImplementedException<std::__cxx11::string>
                  (this,&local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50);
        __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
  }
  return;
}

Assistant:

static void SetSelectionVector(SelectionVector &sel, data_ptr_t indices_p, const LogicalType &logical_type, idx_t size,
                               ValidityMask *mask = nullptr, idx_t last_element_pos = 0) {
	sel.Initialize(size);

	if (mask) {
		switch (logical_type.id()) {
		case LogicalTypeId::UTINYINT:
			SetMaskedSelectionVectorLoop<uint8_t>(sel, indices_p, size, *mask, last_element_pos);
			break;
		case LogicalTypeId::TINYINT:
			SetMaskedSelectionVectorLoop<int8_t>(sel, indices_p, size, *mask, last_element_pos);
			break;
		case LogicalTypeId::USMALLINT:
			SetMaskedSelectionVectorLoop<uint16_t>(sel, indices_p, size, *mask, last_element_pos);
			break;
		case LogicalTypeId::SMALLINT:
			SetMaskedSelectionVectorLoop<int16_t>(sel, indices_p, size, *mask, last_element_pos);
			break;
		case LogicalTypeId::UINTEGER:
			if (last_element_pos > NumericLimits<uint32_t>::Maximum()) {
				//! Its guaranteed that our indices will point to the last element, so just throw an error
				throw ConversionException("DuckDB only supports indices that fit on an uint32");
			}
			SetMaskedSelectionVectorLoop<uint32_t>(sel, indices_p, size, *mask, last_element_pos);
			break;
		case LogicalTypeId::INTEGER:
			SetMaskedSelectionVectorLoop<int32_t>(sel, indices_p, size, *mask, last_element_pos);
			break;
		case LogicalTypeId::UBIGINT:
			if (last_element_pos > NumericLimits<uint32_t>::Maximum()) {
				//! Its guaranteed that our indices will point to the last element, so just throw an error
				throw ConversionException("DuckDB only supports indices that fit on an uint32");
			}
			SetMaskedSelectionVectorLoop<uint64_t>(sel, indices_p, size, *mask, last_element_pos);
			break;
		case LogicalTypeId::BIGINT:
			if (last_element_pos > NumericLimits<uint32_t>::Maximum()) {
				//! Its guaranteed that our indices will point to the last element, so just throw an error
				throw ConversionException("DuckDB only supports indices that fit on an uint32");
			}
			SetMaskedSelectionVectorLoop<int64_t>(sel, indices_p, size, *mask, last_element_pos);
			break;

		default:
			throw NotImplementedException("(Arrow) Unsupported type for selection vectors %s", logical_type.ToString());
		}

	} else {
		switch (logical_type.id()) {
		case LogicalTypeId::UTINYINT:
			SetSelectionVectorLoop<uint8_t>(sel, indices_p, size);
			break;
		case LogicalTypeId::TINYINT:
			SetSelectionVectorLoop<int8_t>(sel, indices_p, size);
			break;
		case LogicalTypeId::USMALLINT:
			SetSelectionVectorLoop<uint16_t>(sel, indices_p, size);
			break;
		case LogicalTypeId::SMALLINT:
			SetSelectionVectorLoop<int16_t>(sel, indices_p, size);
			break;
		case LogicalTypeId::UINTEGER:
			SetSelectionVectorLoop<uint32_t>(sel, indices_p, size);
			break;
		case LogicalTypeId::INTEGER:
			SetSelectionVectorLoop<int32_t>(sel, indices_p, size);
			break;
		case LogicalTypeId::UBIGINT:
			if (last_element_pos > NumericLimits<uint32_t>::Maximum()) {
				//! We need to check if our indexes fit in a uint32_t
				SetSelectionVectorLoopWithChecks<uint64_t>(sel, indices_p, size);
			} else {
				SetSelectionVectorLoop<uint64_t>(sel, indices_p, size);
			}
			break;
		case LogicalTypeId::BIGINT:
			if (last_element_pos > NumericLimits<uint32_t>::Maximum()) {
				//! We need to check if our indexes fit in a uint32_t
				SetSelectionVectorLoopWithChecks<int64_t>(sel, indices_p, size);
			} else {
				SetSelectionVectorLoop<int64_t>(sel, indices_p, size);
			}
			break;
		default:
			throw ConversionException("(Arrow) Unsupported type for selection vectors %s", logical_type.ToString());
		}
	}
}